

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O2

string * __thiscall
stun::attribute::decoding_bits::errcode::reason_phrase_abi_cxx11_
          (string *__return_storage_ptr__,errcode *this)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = stun_attr_errcode_reason((this->super_attribute_base<_stun_attr_errcode>).attr_);
  sVar2 = stun_attr_errcode_reason_len((this->super_attribute_base<_stun_attr_errcode>).attr_);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string reason_phrase() const {
    const char *str = stun_attr_errcode_reason(attr_);
    size_t str_len = stun_attr_errcode_reason_len(attr_);
    return std::string(str, str_len);
  }